

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::setViewport(AbstractScrollArea *this,QWidget *widget)

{
  ScrollIndicator *pSVar1;
  BlurEffect *pBVar2;
  bool bVar3;
  AbstractScrollAreaPrivate *pAVar4;
  QWidget *pQVar5;
  QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
  *this_00;
  QStyleOption local_78 [8];
  QStyleOption opt;
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *oldViewport;
  QWidget *widget_local;
  AbstractScrollArea *this_local;
  
  oldViewport = widget;
  widget_local = (QWidget *)this;
  pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  if (widget != pAVar4->viewport) {
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    local_20 = pAVar4->viewport;
    if (oldViewport == (QWidget *)0x0) {
      pQVar5 = (QWidget *)operator_new(0x28);
      QFlags<Qt::WindowType>::QFlags(&local_24);
      QWidget::QWidget(pQVar5,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_24.i);
      oldViewport = pQVar5;
    }
    pQVar5 = oldViewport;
    this_00 = &this->d;
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(this_00);
    pAVar4->viewport = pQVar5;
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(this_00);
    QWidget::setParent(pAVar4->viewport);
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(this_00);
    QWidget::setFocusProxy(pAVar4->viewport);
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(this_00);
    pSVar1 = pAVar4->horIndicator;
    QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
    ::operator->(this_00);
    QWidget::setParent(&pSVar1->super_QWidget);
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(this_00);
    pSVar1 = pAVar4->vertIndicator;
    QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
    ::operator->(this_00);
    QWidget::setParent(&pSVar1->super_QWidget);
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(this_00);
    pBVar2 = pAVar4->horBlur;
    QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
    ::operator->(this_00);
    QWidget::setParent(&pBVar2->super_QWidget);
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(this_00);
    pBVar2 = pAVar4->vertBlur;
    QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
    ::operator->(this_00);
    QWidget::setParent(&pBVar2->super_QWidget);
    QStyleOption::QStyleOption(local_78,1,0);
    QStyleOption::initFrom((QWidget *)local_78);
    pAVar4 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    AbstractScrollAreaPrivate::layoutChildren(pAVar4,local_78);
    bVar3 = QWidget::isVisible((QWidget *)this);
    if (bVar3) {
      QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
      ::operator->(&this->d);
      QWidget::show();
    }
    (**(code **)(*(long *)this + 0x1a8))(this,oldViewport);
    if (local_20 != (QWidget *)0x0) {
      (**(code **)(*(long *)local_20 + 0x20))();
    }
    QStyleOption::~QStyleOption(local_78);
  }
  return;
}

Assistant:

void
AbstractScrollArea::setViewport( QWidget * widget )
{
	if( widget != d->viewport )
	{
		QWidget *oldViewport = d->viewport;

		if( !widget )
			widget = new QWidget;

		d->viewport = widget;
		d->viewport->setParent( this );
		d->viewport->setFocusProxy( this );
		d->horIndicator->setParent( d->viewport );
		d->vertIndicator->setParent( d->viewport );
		d->horBlur->setParent( d->viewport );
		d->vertBlur->setParent( d->viewport );

		QStyleOption opt;
		opt.initFrom( this );
		d->layoutChildren( opt );

		if( isVisible() )
			d->viewport->show();

		setupViewport( widget );

		delete oldViewport;
	}
}